

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall GEO::Logger::get_local_value(Logger *this,string *name,string *value)

{
  bool bVar1;
  _Base_ptr p_Var2;
  bool local_41;
  string local_40;
  
  bVar1 = std::operator==(name,"log:quiet");
  if (bVar1) {
    local_41 = this->quiet_;
  }
  else {
    bVar1 = std::operator==(name,"log:minimal");
    if (bVar1) {
      local_41 = this->minimal_;
    }
    else {
      bVar1 = std::operator==(name,"log:pretty");
      if (!bVar1) {
        bVar1 = std::operator==(name,"log:file_name");
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)value);
          return true;
        }
        bVar1 = std::operator==(name,"log:features");
        if (bVar1) {
          if (this->log_everything_ == true) {
            std::__cxx11::string::assign((char *)value);
            return true;
          }
          std::__cxx11::string::assign((char *)value);
          for (p_Var2 = (this->log_features_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var2 != &(this->log_features_)._M_t._M_impl.super__Rb_tree_header
              ; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
            if (value->_M_string_length != 0) {
              std::__cxx11::string::push_back((char)value);
            }
            std::__cxx11::string::append((string *)value);
          }
          return true;
        }
        bVar1 = std::operator==(name,"log:features_exclude");
        if (bVar1) {
          std::__cxx11::string::assign((char *)value);
          for (p_Var2 = (this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left;
              (_Rb_tree_header *)p_Var2 !=
              &(this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header;
              p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
            if (value->_M_string_length != 0) {
              std::__cxx11::string::push_back((char)value);
            }
            std::__cxx11::string::append((string *)value);
          }
          return true;
        }
        return false;
      }
      local_41 = this->pretty_;
    }
  }
  String::to_string<bool>(&local_40,&local_41);
  std::__cxx11::string::operator=((string *)value,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

bool Logger::get_local_value(
        const std::string& name, std::string& value
    ) const {

        if(name == "log:quiet") {
            value = String::to_string(is_quiet());
            return true;
        }

        if(name == "log:minimal") {
            value = String::to_string(is_minimal());
            return true;
        }
        
        if(name == "log:pretty") {
            value = String::to_string(is_pretty());
            return true;
        }

        if(name == "log:file_name") {
            value = log_file_name_;
            return true;
        }

        if(name == "log:features") {
            if(log_everything_) {
                value = "*";
            } else {
                value = "";
                for(auto& it : log_features_) {
                    if(value.length() != 0) {
                        value += ';';
                    }
                    value += it;
                }
            }
            return true;
        }

        if(name == "log:features_exclude") {
            value = "";
            for(auto& it : log_features_exclude_) {
                if(value.length() != 0) {
                    value += ';';
                }
                value += it;
            }
            return true;
        }

        return false;
    }